

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

uint32_t __thiscall Cache::getAddr(Cache *this,Block *b)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar2 = (this->policy).blockSize;
  bVar5 = 0xff;
  if (uVar2 != 0) {
    bVar5 = 0;
    if ((uVar2 != 1) && (bVar5 = 0, 1 < uVar2)) {
      bVar5 = 0;
      do {
        bVar5 = bVar5 + 1;
        bVar1 = 3 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar1);
    }
  }
  uVar4 = (ulong)(this->policy).blockNum / (ulong)(this->policy).associativity;
  uVar2 = (uint)uVar4;
  cVar3 = -1;
  if (uVar2 != 0) {
    cVar3 = '\0';
    if ((uVar2 != 1) && (cVar3 = '\0', 1 < uVar2)) {
      cVar3 = '\0';
      do {
        cVar3 = cVar3 + '\x01';
        uVar2 = (uint)uVar4;
        uVar4 = uVar4 >> 1;
      } while (3 < uVar2);
    }
  }
  return b->id << (bVar5 & 0x1f) | b->tag << (cVar3 + bVar5 & 0x1f);
}

Assistant:

uint32_t Cache::getAddr(Cache::Block &b) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  return (b.tag << (offsetBits + idBits)) | (b.id << offsetBits);
}